

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int send_alert(ptls_t *tls,ptls_buffer_t *sendbuf,uint8_t level,uint8_t description)

{
  size_t sVar1;
  size_t body_size;
  size_t local_40;
  size_t body_start;
  size_t capacity;
  size_t sStack_28;
  int ret;
  size_t rec_start;
  uint8_t description_local;
  ptls_buffer_t *ppStack_18;
  uint8_t level_local;
  ptls_buffer_t *sendbuf_local;
  ptls_t *tls_local;
  
  sStack_28 = sendbuf->off;
  capacity._4_4_ = 0;
  capacity._1_1_ = 0x15;
  capacity._2_1_ = 3;
  capacity._3_1_ = 1;
  rec_start._6_1_ = description;
  rec_start._7_1_ = level;
  ppStack_18 = sendbuf;
  sendbuf_local = (ptls_buffer_t *)tls;
  capacity._4_4_ = ptls_buffer__do_pushv(sendbuf,(void *)((long)&capacity + 1),3);
  if (capacity._4_4_ == 0) {
    body_start = 2;
    capacity._4_4_ = ptls_buffer__do_pushv(ppStack_18,"",2);
    if (capacity._4_4_ == 0) {
      local_40 = ppStack_18->off;
      body_size._6_1_ = rec_start._7_1_;
      body_size._7_1_ = rec_start._6_1_;
      capacity._4_4_ = ptls_buffer__do_pushv(ppStack_18,(void *)((long)&body_size + 6),2);
      if (capacity._4_4_ == 0) {
        sVar1 = ppStack_18->off;
        for (; body_start != 0; body_start = body_start - 1) {
          ppStack_18->base[local_40 - body_start] =
               (uint8_t)(sVar1 - local_40 >> (((char)body_start + -1) * '\b' & 0x3fU));
        }
        if (sendbuf_local[7].base != (uint8_t *)0x0) {
          capacity._4_4_ =
               buffer_encrypt_record
                         (ppStack_18,sStack_28,(ptls_aead_context_t *)sendbuf_local[7].base);
        }
      }
    }
  }
  return capacity._4_4_;
}

Assistant:

static int send_alert(ptls_t *tls, ptls_buffer_t *sendbuf, uint8_t level, uint8_t description)
{
    size_t rec_start = sendbuf->off;
    int ret = 0;

    buffer_push_record(sendbuf, PTLS_CONTENT_TYPE_ALERT, { ptls_buffer_push(sendbuf, level, description); });
    if (tls->traffic_protection.enc.aead != NULL &&
        (ret = buffer_encrypt_record(sendbuf, rec_start, tls->traffic_protection.enc.aead)) != 0)
        goto Exit;

Exit:
    return ret;
}